

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O1

void __thiscall
wasm::StubUnsupportedJSOpsPass::visitCallIndirect(StubUnsupportedJSOpsPass *this,CallIndirect *curr)

{
  size_t sVar1;
  Expression *pEVar2;
  Drop *pDVar3;
  Block *value;
  ulong extraout_RDX;
  ulong uVar4;
  optional<wasm::Type> type;
  Drop *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> items;
  Builder local_38;
  Builder builder;
  
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>_>
       ).
       super_PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
       .
       super_Walker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
       .currModule;
  auStack_58 = (undefined1  [8])0x0;
  items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar1 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar1 != 0) {
    uVar4 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar4) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      pEVar2 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [uVar4];
      pDVar3 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar3->value = pEVar2;
      Drop::finalize(pDVar3);
      local_60 = pDVar3;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                 (Expression **)&local_60);
      uVar4 = uVar4 + 1;
    } while (sVar1 != uVar4);
  }
  pEVar2 = curr->target;
  pDVar3 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
  (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  pDVar3->value = pEVar2;
  Drop::finalize(pDVar3);
  local_60 = pDVar3;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
             (Expression **)&local_60);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  value = Builder::
          makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                    (&local_38,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58,
                     type);
  stubOut(this,(Expression *)value,
          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)items.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    // Indirect calls of the wrong type trap in wasm, but not in wasm2js. Remove
    // the indirect call, but leave the arguments.
    Builder builder(*getModule());
    std::vector<Expression*> items;
    for (auto* operand : curr->operands) {
      items.push_back(builder.makeDrop(operand));
    }
    items.push_back(builder.makeDrop(curr->target));
    stubOut(builder.makeBlock(items), curr->type);
  }